

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::hideChildren(QWidgetPrivate *this,bool spontaneous)

{
  byte bVar1;
  bool bVar2;
  QWidget *pQVar3;
  QLoggingCategory *cat;
  qsizetype qVar4;
  QDebug *pQVar5;
  WId WVar6;
  byte in_SIL;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *widgetWindow;
  QWidget *widget;
  int i;
  QWidget *q;
  QHideEvent e;
  QList<QObject_*> childList;
  QAccessibleEvent event;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffec8;
  QWidget *in_stack_fffffffffffffed8;
  QWidget *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int iVar7;
  undefined7 in_stack_fffffffffffffef8;
  QWidgetPrivate *attributes;
  QApplicationPrivate *in_stack_ffffffffffffff08;
  QWidget *in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff33;
  WidgetAttribute in_stack_ffffffffffffff34;
  QWidget *in_stack_ffffffffffffff38;
  QDebug local_c0;
  QDebug in_stack_ffffffffffffff48;
  QDebug in_stack_ffffffffffffff50;
  QDebug local_a8;
  QDebug local_a0;
  QList<QObject_*> local_98 [2];
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QWidget *widget_00;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  attributes = in_RDI;
  pQVar3 = q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcWidgetShowHide();
  anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,in_stack_fffffffffffffec8);
  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
    anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3798d4);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (int)((ulong)in_RDI >> 0x20),(char *)in_stack_fffffffffffffec8,(char *)0x3798ed);
    QMessageLogger::debug();
    pQVar5 = QDebug::operator<<((QDebug *)
                                CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                (char *)in_stack_ffffffffffffff18);
    QDebug::QDebug(&local_58,pQVar5);
    ::operator<<((QDebug *)in_stack_ffffffffffffff50.stream,
                 (QWidget *)in_stack_ffffffffffffff48.stream);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       (char *)in_stack_ffffffffffffff18);
    QDebug::operator<<((QDebug *)in_RDI,SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0));
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug(&local_60);
    local_10 = 0;
  }
  local_98[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98[0].d.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_98[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QObject_*>::QList((QList<QObject_*> *)in_RDI,(QList<QObject_*> *)in_stack_fffffffffffffec8);
  iVar7 = 0;
  while( true ) {
    cat = (QLoggingCategory *)(long)iVar7;
    qVar4 = QList<QObject_*>::size(local_98);
    if (qVar4 <= (long)cat) break;
    QList<QObject_*>::at((QList<QObject_*> *)in_RDI,(qsizetype)cat);
    in_stack_fffffffffffffee0 = qobject_cast<QWidget*>((QObject *)cat);
    if (in_stack_fffffffffffffee0 != (QWidget *)0x0) {
      widget_00 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcWidgetShowHide();
      anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,cat);
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffd8), bVar2) {
        anon_unknown.dwarf_2490c2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x379a8c);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                   (int)((ulong)in_RDI >> 0x20),(char *)cat,(char *)0x379aa2);
        QMessageLogger::debug();
        pQVar5 = QDebug::operator<<((QDebug *)CONCAT44(iVar7,in_stack_fffffffffffffee8),
                                    (char *)in_stack_ffffffffffffff18);
        QDebug::QDebug((QDebug *)&stack0xffffffffffffff48,pQVar5);
        ::operator<<((QDebug *)in_stack_ffffffffffffff50.stream,
                     (QWidget *)in_stack_ffffffffffffff48.stream);
        pQVar5 = QDebug::operator<<((QDebug *)CONCAT44(iVar7,in_stack_fffffffffffffee8),
                                    (char *)in_stack_ffffffffffffff18);
        QDebug::QDebug(&local_a8,pQVar5);
        in_stack_ffffffffffffff18 = in_stack_fffffffffffffee0;
        anon_unknown.dwarf_2490c2::operator<<
                  ((QDebug *)in_stack_ffffffffffffff08,(WidgetAttributes *)attributes);
        QDebug::~QDebug(&local_a0);
        QDebug::~QDebug(&local_a8);
        QDebug::~QDebug((QDebug *)&stack0xffffffffffffff50);
        QDebug::~QDebug((QDebug *)&stack0xffffffffffffff48);
        QDebug::~QDebug(&local_c0);
      }
      bVar2 = QWidget::isWindow((QWidget *)in_RDI);
      if ((!bVar2) && (bVar2 = QWidget::isVisible((QWidget *)0x379b97), bVar2)) {
        if ((bVar1 & 1) == 0) {
          QWidget::setAttribute
                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                     (bool)in_stack_ffffffffffffff33);
        }
        else {
          QWidget::setAttribute
                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                     (bool)in_stack_ffffffffffffff33);
        }
        QWidget::d_func((QWidget *)0x379bd5);
        hideChildren((QWidgetPrivate *)CONCAT17(bVar1,in_stack_fffffffffffffef8),
                     SUB81((ulong)pQVar3 >> 0x38,0));
        in_stack_ffffffffffffff08 = (QApplicationPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QHideEvent::QHideEvent((QHideEvent *)&stack0xffffffffffffff08);
        if ((bVar1 & 1) == 0) {
          QCoreApplication::sendEvent
                    (&in_stack_fffffffffffffee0->super_QObject,(QEvent *)&stack0xffffffffffffff08);
          WVar6 = QWidget::internalWinId(in_stack_fffffffffffffee0);
          if ((WVar6 != 0) &&
             (bVar2 = QWidget::testAttribute
                                (in_stack_fffffffffffffed8,(WidgetAttribute)((ulong)in_RDI >> 0x20))
             , bVar2)) {
            QWidget::d_func((QWidget *)0x379c5e);
            hide_sys((QWidgetPrivate *)CONCAT44(iVar7,in_stack_fffffffffffffee8));
          }
        }
        else {
          QCoreApplication::sendSpontaneousEvent
                    (&in_stack_fffffffffffffee0->super_QObject,(QEvent *)&stack0xffffffffffffff08);
        }
        QCoreApplication::instance();
        QApplication::d_func((QApplication *)0x379c75);
        QApplicationPrivate::sendSyntheticEnterLeave(in_stack_ffffffffffffff08,widget_00);
        if ((bVar1 & 1) == 0) {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_38 = &DAT_aaaaaaaaaaaaaaaa;
          local_30 = &DAT_aaaaaaaaaaaaaaaa;
          QAccessibleEvent::QAccessibleEvent
                    ((QAccessibleEvent *)&local_48,&in_stack_fffffffffffffee0->super_QObject,
                     ObjectHide);
          QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
          QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
        }
        QHideEvent::~QHideEvent((QHideEvent *)&stack0xffffffffffffff08);
      }
    }
    iVar7 = iVar7 + 1;
  }
  pQVar3 = QWidget::window(in_stack_fffffffffffffee0);
  if ((pQVar3 != (QWidget *)0x0) && ((*(uint *)&pQVar3->data->field_0x10 >> 9 & 1) != 0)) {
    QWidget::setAttribute
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,(bool)in_stack_ffffffffffffff33);
  }
  QList<QObject_*>::~QList((QList<QObject_*> *)0x379d5c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::hideChildren(bool spontaneous)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Hiding children of" << q
                              << "spontaneously" << spontaneous;

    QList<QObject*> childList = children;
    for (int i = 0; i < childList.size(); ++i) {
        QWidget *widget = qobject_cast<QWidget*>(childList.at(i));
        if (!widget)
            continue;
        qCDebug(lcWidgetShowHide) << "Considering" << widget
              << "with attributes" << WidgetAttributes{widget};
        if (widget->isWindow() || !widget->isVisible())
            continue;

        if (spontaneous)
            widget->setAttribute(Qt::WA_Mapped, false);
        else
            widget->setAttribute(Qt::WA_WState_Visible, false);
        widget->d_func()->hideChildren(spontaneous);
        QHideEvent e;
        if (spontaneous) {
            QApplication::sendSpontaneousEvent(widget, &e);
        } else {
            QCoreApplication::sendEvent(widget, &e);
            if (widget->internalWinId()
                && widget->testAttribute(Qt::WA_DontCreateNativeAncestors)) {
                // hide_sys() on an ancestor won't have any affect on this
                // widget, so it needs an explicit hide_sys() of its own
                widget->d_func()->hide_sys();
            }
        }
        qApp->d_func()->sendSyntheticEnterLeave(widget);
#if QT_CONFIG(accessibility)
        if (!spontaneous) {
            QAccessibleEvent event(widget, QAccessible::ObjectHide);
            QAccessible::updateAccessibility(&event);
        }
#endif
    }

    // If the window of this widget is not closed, then the leave event
    // will eventually handle the widget under mouse use case.
    // Otherwise, we need to explicitly handle it here.
    if (QWidget* widgetWindow = q->window();
        widgetWindow && widgetWindow->data->is_closing) {
        q->setAttribute(Qt::WA_UnderMouse, false);
    }
}